

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

bool __thiscall Ptex::v2_4::PtexReader::reopenFP(PtexReader *this)

{
  int iVar1;
  undefined4 extraout_var;
  uint size;
  char *error;
  ExtHeader extheaderval;
  Header headerval;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 local_58 [28];
  uint local_3c;
  
  if (this->_fp != (Handle)0x0) {
    return true;
  }
  iVar1 = (*this->_io->_vptr_PtexInputHandler[2])(this->_io,(this->_path)._M_dataplus._M_p);
  this->_fp = (Handle)CONCAT44(extraout_var,iVar1);
  if ((Handle)CONCAT44(extraout_var,iVar1) == (Handle)0x0) {
    error = "Can\'t reopen";
  }
  else {
    this->_pos = 0;
    readBlock(this,local_58,0x40,true);
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    size = 0x28;
    if (local_3c < 0x28) {
      size = local_3c;
    }
    readBlock(this,&local_88,size,true);
    iVar1 = bcmp(local_58,&this->_header,0x40);
    if ((iVar1 == 0) && (iVar1 = bcmp(&local_88,&this->_extheader,0x28), iVar1 == 0)) {
      LOCK();
      this->_opens = this->_opens + 1;
      UNLOCK();
      return true;
    }
    error = "Header mismatch on reopen of";
  }
  setError(this,error);
  return false;
}

Assistant:

bool PtexReader::reopenFP()
{
    if (_fp) return true;

    // we assume this is called lazily in a scope where readlock is already held
    _fp = _io->open(_path.c_str());
    if (!_fp) {
        setError("Can't reopen");
        return false;
    }
    _pos = 0;
    Header headerval;
    ExtHeader extheaderval;
    readBlock(&headerval, HeaderSize);
    memset(&extheaderval, 0, sizeof(extheaderval));
    readBlock(&extheaderval, PtexUtils::min(uint32_t(ExtHeaderSize), headerval.extheadersize));
    if (0 != memcmp(&headerval, &_header, sizeof(headerval)) ||
        0 != memcmp(&extheaderval, &_extheader, sizeof(extheaderval)))
    {
        setError("Header mismatch on reopen of");
        return false;
    }
    logOpen();
    return true;
}